

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

XrResult ApiDumpLayerXrDestroyGeometryInstanceFB(XrGeometryInstanceFB instance)

{
  long lVar1;
  long lVar2;
  XrResult XVar3;
  iterator iVar4;
  key_type in_RDI;
  unique_lock<std::mutex> lock;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  ostringstream oss_instance;
  key_type local_1e0;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1b8;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1a0;
  unique_lock<std::mutex> local_188;
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  local_1b8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1b8.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_188._M_device = &g_geometryinstancefb_dispatch_mutex;
  local_188._M_owns = false;
  local_1e0 = in_RDI;
  std::unique_lock<std::mutex>::lock(&local_188);
  local_188._M_owns = true;
  iVar4 = std::
          _Hashtable<XrGeometryInstanceFB_T_*,_std::pair<XrGeometryInstanceFB_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrGeometryInstanceFB_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrGeometryInstanceFB_T_*>,_std::hash<XrGeometryInstanceFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_geometryinstancefb_dispatch_map._M_h,&local_1e0);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrGeometryInstanceFB_T_*const,_XrGeneratedDispatchTable_*>,_false>
      ._M_cur == (__node_type *)0x0) {
    std::unique_lock<std::mutex>::~unique_lock(&local_188);
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    lVar1 = *(long *)((long)iVar4.
                            super__Node_iterator_base<std::pair<XrGeometryInstanceFB_T_*const,_XrGeneratedDispatchTable_*>,_false>
                            ._M_cur + 0x10);
    std::unique_lock<std::mutex>::~unique_lock(&local_188);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[28],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_1b8,(char (*) [9])"XrResult",(char (*) [28])"xrDestroyGeometryInstanceFB",
               (char (*) [1])0x29fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_188);
    lVar2 = *(long *)((long)&local_188._M_device[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_170 + lVar2) = *(uint *)((long)auStack_170 + lVar2) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&local_188);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[21],char_const(&)[9],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&local_1b8,(char (*) [21])"XrGeometryInstanceFB",(char (*) [9])"instance",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._0_8_ != &local_1c8) {
      operator_delete((void *)local_1d8._0_8_,local_1c8._M_allocated_capacity + 1);
    }
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_1a0,&local_1b8);
    ApiDumpLayerRecordContent(&local_1a0);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_1a0);
    XVar3 = (**(code **)(lVar1 + 0x4a8))(local_1e0);
    iVar4 = std::
            _Hashtable<XrGeometryInstanceFB_T_*,_std::pair<XrGeometryInstanceFB_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrGeometryInstanceFB_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrGeometryInstanceFB_T_*>,_std::hash<XrGeometryInstanceFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find(&g_geometryinstancefb_dispatch_map._M_h,&local_1e0);
    if (iVar4.
        super__Node_iterator_base<std::pair<XrGeometryInstanceFB_T_*const,_XrGeneratedDispatchTable_*>,_false>
        ._M_cur != (__node_type *)0x0) {
      local_1d8._0_8_ = &g_geometryinstancefb_dispatch_mutex;
      local_1d8[8] = false;
      std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)local_1d8);
      local_1d8[8] = true;
      std::
      _Hashtable<XrGeometryInstanceFB_T_*,_std::pair<XrGeometryInstanceFB_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrGeometryInstanceFB_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrGeometryInstanceFB_T_*>,_std::hash<XrGeometryInstanceFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::_M_erase(&g_geometryinstancefb_dispatch_map._M_h,&local_1e0);
      std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_1d8);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_188);
    std::ios_base::~ios_base(local_118);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_1b8);
  return XVar3;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrDestroyGeometryInstanceFB(
    XrGeometryInstanceFB instance) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_geometryinstancefb_dispatch_mutex);
            auto map_iter = g_geometryinstancefb_dispatch_map.find(instance);
            if (map_iter == g_geometryinstancefb_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrDestroyGeometryInstanceFB", "");
        std::ostringstream oss_instance;
        oss_instance << std::hex << reinterpret_cast<const void*>(instance);
        contents.emplace_back("XrGeometryInstanceFB", "instance", oss_instance.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->DestroyGeometryInstanceFB(instance);
        auto exists = g_geometryinstancefb_dispatch_map.find(instance);
        if (exists != g_geometryinstancefb_dispatch_map.end()) {
            std::unique_lock<std::mutex> lock(g_geometryinstancefb_dispatch_mutex);
            g_geometryinstancefb_dispatch_map.erase(instance);
        }
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}